

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hxx
# Opt level: O3

XMLNodeAdapter *
FileParse::operator<<
          (XMLNodeAdapter *node,
          Child<const_std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>_>
          *vec)

{
  pointer pAVar1;
  pointer pbVar2;
  pointer angleBasisBlock;
  string_view name;
  XMLNodeAdapter secondToLastNode;
  XMLNodeAdapter lastNode;
  XMLNodeAdapter local_60;
  XMLNodeAdapter local_48;
  
  if (((vec->nodeNames).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (vec->nodeNames).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((vec->data->
      super__Vector_base<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (vec->data->
      super__Vector_base<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>).
      _M_impl.super__Vector_impl_data._M_finish)) {
    insertAllButLastChild<XMLNodeAdapter>(&local_60,node,&vec->nodeNames);
    angleBasisBlock =
         (vec->data->
         super__Vector_base<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>).
         _M_impl.super__Vector_impl_data._M_start;
    pAVar1 = (vec->data->
             super__Vector_base<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (angleBasisBlock != pAVar1) {
      pbVar2 = (vec->nodeNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        name._M_str = pbVar2[-1]._M_dataplus._M_p;
        name._M_len = pbVar2[-1]._M_string_length;
        XMLNodeAdapter::addChild(&local_48,&local_60,name);
        BSDFData::operator<<(&local_48,angleBasisBlock);
        local_48.super_INodeAdapter<XMLNodeAdapter>._vptr_INodeAdapter =
             (_func_int **)&PTR__XMLNodeAdapter_001dcb90;
        if (local_48.pimpl_.super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.pimpl_.
                     super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        angleBasisBlock = angleBasisBlock + 1;
      } while (angleBasisBlock != pAVar1);
    }
    local_60.super_INodeAdapter<XMLNodeAdapter>._vptr_INodeAdapter =
         (_func_int **)&PTR__XMLNodeAdapter_001dcb90;
    if (local_60.pimpl_.super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.pimpl_.
                 super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  return node;
}

Assistant:

inline NodeAdapter & operator<<(NodeAdapter & node, const Child<const std::vector<T>> & vec)
    {
        if(vec.nodeNames.empty() || vec.data.empty())
            return node;

        auto secondToLastNode{insertAllButLastChild(node, vec.nodeNames)};

        const auto & lastNodeName = vec.nodeNames.back();

        for(const auto & item : vec.data)
        {
            NodeAdapter lastNode = secondToLastNode.addChild(lastNodeName);
            lastNode << item;
        }

        return node;
    }